

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_order_segments(REF_INT n,REF_INT *c2n,REF_INT *order)

{
  REF_STATUS RVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n == 0) {
    return 0;
  }
  uVar3 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  iVar2 = -1;
  for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    uVar7 = 0;
    do {
      if ((uint)n == uVar7) {
        iVar2 = (int)uVar3;
        goto LAB_0016e424;
      }
      lVar4 = uVar7 * 2;
      uVar7 = uVar7 + 1;
    } while (c2n[uVar3 * 2] != c2n[lVar4 + 1]);
  }
LAB_0016e424:
  iVar5 = iVar2;
  if (iVar2 == -1) {
    iVar5 = 0;
  }
  *order = iVar5;
  lVar4 = 1;
  do {
    if (n <= lVar4) {
      RVar1 = 0;
      if (iVar2 == -1) {
        if (*c2n != c2n[(long)order[(long)n + -1] * 2 + 1]) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xb08,"ref_export_order_segments","first and last do not match for loop",(long)*c2n
                 ,(long)c2n[(long)order[(long)n + -1] * 2 + 1]);
LAB_0016e48e:
          RVar1 = 1;
        }
      }
      return RVar1;
    }
    uVar3 = 0;
    while( true ) {
      if ((uint)n == uVar3) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xb03,"ref_export_order_segments","next segment not found");
        goto LAB_0016e48e;
      }
      if (c2n[(long)order[lVar4 + -1] * 2 + 1] == c2n[uVar3 * 2]) break;
      uVar3 = uVar3 + 1;
    }
    order[lVar4] = (REF_INT)uVar3;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_export_order_segments(REF_INT n, REF_INT *c2n,
                                             REF_INT *order) {
  REF_INT i, j, first_cell;
  REF_BOOL found, loop;

  if (0 == n) return REF_SUCCESS;

  first_cell = REF_EMPTY;
  for (i = 0; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[0 + 2 * i] == c2n[1 + 2 * j]) {
        found = REF_TRUE;
        break;
      }
    }
    if (!found) {
      first_cell = i;
      break;
    }
  }

  /* arbitrary for loops */
  loop = REF_FALSE;
  if (REF_EMPTY == first_cell) {
    loop = REF_TRUE;
    first_cell = 0;
  }

  order[0] = first_cell;
  for (i = 1; i < n; i++) {
    found = REF_FALSE;
    for (j = 0; j < n; j++) {
      if (c2n[1 + 2 * order[i - 1]] == c2n[0 + 2 * j]) {
        order[i] = j;
        found = REF_TRUE;
        break;
      }
    }
    RAS(found, "next segment not found");
  }

  if (loop)
    REIS(c2n[0 + 2 * order[0]], c2n[1 + 2 * order[n - 1]],
         "first and last do not match for loop");

  return REF_SUCCESS;
}